

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

bool __thiscall CClient::LimitFps(CClient *this)

{
  long lVar1;
  CConfig *pCVar2;
  int64 iVar3;
  CClient *in_RDI;
  double dVar4;
  double d;
  int64 LastT;
  double Freq;
  double DesiredTime;
  double RenderDeltaTime;
  bool SkipFrame;
  double LastCpuFrameTime;
  int64 Now;
  double local_50;
  double local_30;
  int64 local_18;
  bool local_1;
  
  pCVar2 = Config(in_RDI);
  if ((pCVar2->m_GfxVsync == 0) && (pCVar2 = Config(in_RDI), pCVar2->m_GfxLimitFps != 0)) {
    local_18 = time_get();
    lVar1 = in_RDI->m_LastCpuTime;
    iVar3 = time_freq();
    in_RDI->m_LastAvgCpuFrameTime =
         (float)((((double)(local_18 - lVar1) / (double)iVar3) * 4.0 +
                 (double)in_RDI->m_LastAvgCpuFrameTime) / 5.0);
    in_RDI->m_LastCpuTime = local_18;
    local_1 = true;
    lVar1 = in_RDI->m_LastRenderTime;
    iVar3 = time_freq();
    local_30 = (double)(local_18 - lVar1) / (double)iVar3;
    pCVar2 = Config(in_RDI);
    dVar4 = 1.0 / (double)pCVar2->m_GfxMaxFps;
    if ((local_30 < dVar4) && (dVar4 - local_30 < (double)in_RDI->m_LastAvgCpuFrameTime * 1.2)) {
      iVar3 = time_freq();
      lVar1 = in_RDI->m_LastRenderTime;
      while (local_50 = dVar4 - local_30, 1e-05 < local_50) {
        local_18 = time_get();
        cpu_relax();
        local_30 = (double)(local_18 - lVar1) / (double)iVar3;
      }
      local_1 = false;
      in_RDI->m_LastCpuTime = local_18;
    }
    if ((local_1 != false) && (dVar4 < local_30)) {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CClient::LimitFps()
{
	if(Config()->m_GfxVsync || !Config()->m_GfxLimitFps) return false;

	/**
		If desired frame time is not reached:
			Skip rendering the frame
			Do another game loop

		If we don't have the time to do another game loop:
			Wait until desired frametime

		Returns true if frame should be skipped
	**/

#ifdef CONF_DEBUG
	static double DbgTimeWaited = 0.0;
	static int64 DbgFramesSkippedCount = 0;
	static int64 DbgLastSkippedDbgMsg = time_get();
#endif

	int64 Now = time_get();
	const double LastCpuFrameTime = (Now - m_LastCpuTime) / (double)time_freq();
	m_LastAvgCpuFrameTime = (m_LastAvgCpuFrameTime + LastCpuFrameTime * 4.0) / 5.0;
	m_LastCpuTime = Now;

	bool SkipFrame = true;
	double RenderDeltaTime = (Now - m_LastRenderTime) / (double)time_freq();
	const double DesiredTime = 1.0/Config()->m_GfxMaxFps;

	// we can't skip another frame, so wait instead
	if(SkipFrame && RenderDeltaTime < DesiredTime &&
	   m_LastAvgCpuFrameTime * 1.20 > (DesiredTime - RenderDeltaTime))
	{
#ifdef CONF_DEBUG
		DbgTimeWaited += DesiredTime - RenderDeltaTime;
#endif
		const double Freq = (double)time_freq();
		const int64 LastT = m_LastRenderTime;
		double d = DesiredTime - RenderDeltaTime;
		while(d > 0.00001)
		{
			Now = time_get();
			RenderDeltaTime = (Now - LastT) / Freq;
			d = DesiredTime - RenderDeltaTime;
			cpu_relax();
		}

		SkipFrame = false;
		m_LastCpuTime = Now;
	}

	// RenderDeltaTime exceeds DesiredTime, render
	if(SkipFrame && RenderDeltaTime > DesiredTime)
	{
		SkipFrame = false;
	}

#ifdef CONF_DEBUG
	DbgFramesSkippedCount += SkipFrame? 1:0;

	Now = time_get();
	if(Config()->m_GfxLimitFps &&
	   Config()->m_Debug &&
	   (Now - DbgLastSkippedDbgMsg) / (double)time_freq() > 5.0)
	{
		char aBuf[128];
		str_format(aBuf, sizeof(aBuf), "LimitFps: FramesSkippedCount=%lu TimeWaited=%.3f (per sec)",
				   (unsigned long)(DbgFramesSkippedCount/5),
				   DbgTimeWaited/5.0);
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client", aBuf);
		DbgFramesSkippedCount = 0;
		DbgTimeWaited = 0;
		DbgLastSkippedDbgMsg = Now;
	}
#endif

	return SkipFrame;
}